

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void leveldb::AppendEscapedStringTo(string *str,Slice *value)

{
  ulong uVar1;
  char buf [10];
  char local_32 [10];
  
  if (value->size_ != 0) {
    uVar1 = 0;
    do {
      if ((byte)(value->data_[uVar1] - 0x20U) < 0x5f) {
        std::__cxx11::string::push_back((char)str);
      }
      else {
        snprintf(local_32,10,"\\x%02x");
        std::__cxx11::string::append((char *)str);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < value->size_);
  }
  return;
}

Assistant:

void AppendEscapedStringTo(std::string* str, const Slice& value) {
  for (size_t i = 0; i < value.size(); i++) {
    char c = value[i];
    if (c >= ' ' && c <= '~') {
      str->push_back(c);
    } else {
      char buf[10];
      snprintf(buf, sizeof(buf), "\\x%02x",
               static_cast<unsigned int>(c) & 0xff);
      str->append(buf);
    }
  }
}